

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

void __thiscall duckdb_parquet::SchemaElement::SchemaElement(SchemaElement *this)

{
  LogicalType *in_RDI;
  
  duckdb_apache::thrift::TBase::TBase((TBase *)in_RDI);
  *(undefined ***)in_RDI = &PTR__SchemaElement_00c018f8;
  *(undefined ***)in_RDI = &PTR__SchemaElement_00c018f8;
  *(undefined4 *)&in_RDI->STRING = 0;
  *(undefined4 *)&(in_RDI->STRING).field_0x4 = 0;
  *(undefined4 *)&in_RDI->MAP = 0;
  std::__cxx11::string::string((string *)&in_RDI->LIST);
  *(undefined4 *)&in_RDI->DATE = 0;
  *(undefined4 *)&(in_RDI->DATE).field_0x4 = 0;
  *(undefined4 *)&in_RDI->TIME = 0;
  *(undefined4 *)&(in_RDI->TIME).field_0x4 = 0;
  *(undefined4 *)&(in_RDI->TIME).isAdjustedToUTC = 0;
  LogicalType::LogicalType(in_RDI);
  _SchemaElement__isset::_SchemaElement__isset((_SchemaElement__isset *)&in_RDI[1].TIME.unit);
  return;
}

Assistant:

SchemaElement::SchemaElement() noexcept
   : type(static_cast<Type::type>(0)),
     type_length(0),
     repetition_type(static_cast<FieldRepetitionType::type>(0)),
     name(),
     num_children(0),
     converted_type(static_cast<ConvertedType::type>(0)),
     scale(0),
     precision(0),
     field_id(0) {
}